

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.h
# Opt level: O0

void __thiscall imrt::ApertureILS::~ApertureILS(ApertureILS *this)

{
  ApertureILS *in_RDI;
  
  ~ApertureILS(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~ApertureILS() {}